

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

TArray<FSoundID,_FSoundID> * __thiscall
TArray<FSoundID,_FSoundID>::operator=
          (TArray<FSoundID,_FSoundID> *this,TArray<FSoundID,_FSoundID> *other)

{
  TArray<FSoundID,_FSoundID> *other_local;
  TArray<FSoundID,_FSoundID> *this_local;
  
  if (other != this) {
    if (this->Array != (FSoundID *)0x0) {
      if (this->Count != 0) {
        DoDelete(this,0,this->Count - 1);
      }
      M_Free(this->Array);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}